

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrent_echo_server.cpp
# Opt level: O3

void __thiscall echo_server::handle_timeout(echo_server *this,tcp_connection *conn)

{
  undefined8 uVar1;
  pthread_t pVar2;
  char *pcVar3;
  ostream *poVar4;
  ushort uVar5;
  pair<std::_Rb_tree_iterator<ranger::event::tcp_connection>,_std::_Rb_tree_iterator<ranger::event::tcp_connection>_>
  pVar6;
  allocator local_49;
  char *local_48;
  long local_40;
  char local_38 [16];
  
  uVar1 = ranger::event::tcp_connection::remote_endpoint();
  poVar4 = (ostream *)&std::cerr;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"thread[",7);
  pVar2 = pthread_self();
  if (pVar2 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"thread::id of a non-executing thread",0x24);
  }
  else {
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"connection[",0xb);
  pcVar3 = inet_ntoa((in_addr)(in_addr_t)((ulong)uVar1 >> 0x20));
  std::__cxx11::string::string((string *)&local_48,pcVar3,&local_49);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
  uVar5 = (ushort)((ulong)uVar1 >> 0x10);
  poVar4 = (ostream *)
           std::ostream::operator<<((ostream *)poVar4,(uint)(ushort)(uVar5 << 8 | uVar5 >> 8));
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"timeout.",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  pVar6 = std::
          _Rb_tree<ranger::event::tcp_connection,_ranger::event::tcp_connection,_std::_Identity<ranger::event::tcp_connection>,_std::less<ranger::event::tcp_connection>,_std::allocator<ranger::event::tcp_connection>_>
          ::equal_range(&(this->m_conn_set)._M_t,conn);
  std::
  _Rb_tree<ranger::event::tcp_connection,_ranger::event::tcp_connection,_std::_Identity<ranger::event::tcp_connection>,_std::less<ranger::event::tcp_connection>,_std::allocator<ranger::event::tcp_connection>_>
  ::_M_erase_aux(&(this->m_conn_set)._M_t,(_Base_ptr)pVar6.first._M_node,
                 (_Base_ptr)pVar6.second._M_node);
  return;
}

Assistant:

void handle_timeout(ranger::event::tcp_connection& conn) {
		auto ep = conn.remote_endpoint();
		std::cerr << "thread[" << std::this_thread::get_id() << "] " << "connection[" << ep << "] " << "timeout." << std::endl;

		m_conn_set.erase(conn);
	}